

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_trotter.cpp
# Opt level: O2

void trotter<std::complex<float>>
               (QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *circuit)

{
  int iVar1;
  float fVar2;
  R pi;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_a0;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_88;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_80;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_78;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_70;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_68;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_60;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_58;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_50;
  _Head_base<0UL,_qclab::QObject<std::complex<float>_>_*,_false> local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_90 = 3.1415927;
  local_3c = (**(circuit->super_QObject<std::complex<float>_>)._vptr_QObject)();
  local_34 = 0;
  local_38 = 0;
  if (0 < (int)local_3c) {
    local_38 = local_3c;
  }
  for (; local_34 != local_38; local_34 = local_34 + 1) {
    iVar1 = local_3c - ((local_34 ^ local_3c) & 1);
    fVar2 = (float)(local_34 & 1);
    for (local_98 = fVar2; (int)local_98 < iVar1; local_98 = (float)((int)local_98 + 1)) {
      std::make_unique<qclab::qgates::RotationZ<std::complex<float>>,int&,float_const&>
                ((int *)&local_a0,&local_98);
      local_48._M_head_impl = local_a0._M_head_impl;
      local_a0._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                          *)&local_48);
      if (local_48._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_48._M_head_impl)->_vptr_QObject[0xd])();
      }
      local_48._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      if (local_a0._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_a0._M_head_impl)->_vptr_QObject[0xd])();
      }
    }
    while ((int)fVar2 < iVar1 + -1) {
      local_94 = local_90 * 0.5;
      local_98 = fVar2;
      std::make_unique<qclab::qgates::RotationX<std::complex<float>>,int&,float>
                ((int *)&local_a0,&local_98);
      local_50._M_head_impl = local_a0._M_head_impl;
      local_a0._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                          *)&local_50);
      if (local_50._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_50._M_head_impl)->_vptr_QObject[0xd])();
      }
      local_50._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      if (local_a0._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_a0._M_head_impl)->_vptr_QObject[0xd])();
      }
      local_94 = (float)((int)local_98 + 1);
      local_8c = local_90 * 0.5;
      std::make_unique<qclab::qgates::RotationX<std::complex<float>>,int,float>
                ((int *)&local_a0,&local_94);
      local_58._M_head_impl = local_a0._M_head_impl;
      local_a0._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                          *)&local_58);
      if (local_58._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_58._M_head_impl)->_vptr_QObject[0xd])();
      }
      local_58._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      if (local_a0._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_a0._M_head_impl)->_vptr_QObject[0xd])();
      }
      local_94 = (float)((int)local_98 + 1);
      std::make_unique<qclab::qgates::CX<std::complex<float>>,int&,int>
                ((int *)&local_a0,(int *)&local_98);
      local_60._M_head_impl = local_a0._M_head_impl;
      local_a0._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                          *)&local_60);
      if (local_60._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_60._M_head_impl)->_vptr_QObject[0xd])();
      }
      local_60._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      if (local_a0._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_a0._M_head_impl)->_vptr_QObject[0xd])();
      }
      std::make_unique<qclab::qgates::RotationX<std::complex<float>>,int&,float_const&>
                ((int *)&local_a0,&local_98);
      local_68._M_head_impl = local_a0._M_head_impl;
      local_a0._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                          *)&local_68);
      if (local_68._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_68._M_head_impl)->_vptr_QObject[0xd])();
      }
      local_68._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      if (local_a0._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_a0._M_head_impl)->_vptr_QObject[0xd])();
      }
      local_94 = (float)((int)local_98 + 1);
      std::make_unique<qclab::qgates::RotationZ<std::complex<float>>,int,float_const&>
                ((int *)&local_a0,&local_94);
      local_70._M_head_impl = local_a0._M_head_impl;
      local_a0._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                          *)&local_70);
      if (local_70._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_70._M_head_impl)->_vptr_QObject[0xd])();
      }
      local_70._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      if (local_a0._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_a0._M_head_impl)->_vptr_QObject[0xd])();
      }
      local_94 = (float)((int)local_98 + 1);
      std::make_unique<qclab::qgates::CX<std::complex<float>>,int&,int>
                ((int *)&local_a0,(int *)&local_98);
      local_78._M_head_impl = local_a0._M_head_impl;
      local_a0._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                          *)&local_78);
      if (local_78._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_78._M_head_impl)->_vptr_QObject[0xd])();
      }
      local_78._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      if (local_a0._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_a0._M_head_impl)->_vptr_QObject[0xd])();
      }
      local_94 = local_90 * -0.5;
      std::make_unique<qclab::qgates::RotationX<std::complex<float>>,int&,float>
                ((int *)&local_a0,&local_98);
      local_80._M_head_impl = local_a0._M_head_impl;
      local_a0._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                          *)&local_80);
      if (local_80._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_80._M_head_impl)->_vptr_QObject[0xd])();
      }
      local_80._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      if (local_a0._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_a0._M_head_impl)->_vptr_QObject[0xd])();
      }
      local_94 = (float)((int)local_98 + 1);
      local_8c = local_90 * -0.5;
      std::make_unique<qclab::qgates::RotationX<std::complex<float>>,int,float>
                ((int *)&local_a0,&local_94);
      local_88._M_head_impl = local_a0._M_head_impl;
      local_a0._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (circuit,(unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                          *)&local_88);
      if (local_88._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_88._M_head_impl)->_vptr_QObject[0xd])();
      }
      local_88._M_head_impl = (QObject<std::complex<float>_> *)0x0;
      if (local_a0._M_head_impl != (QObject<std::complex<float>_> *)0x0) {
        (*(local_a0._M_head_impl)->_vptr_QObject[0xd])();
      }
      fVar2 = (float)((int)local_98 + 2);
    }
  }
  return;
}

Assistant:

void trotter( qclab::QCircuit< T >& circuit ) {

  using R  = qclab::real_t< T > ;
  using RX = qclab::qgates::RotationX< T > ;
  using RZ = qclab::qgates::RotationZ< T > ;
  using CX = qclab::qgates::CNOT< T > ;

  // constants
  const R pi = 4 * std::atan(1) ;
  const int n = circuit.nbQubits() ;

  // layers
  for ( int lyr = 0; lyr < n; lyr++ ) {
    int os = ( lyr % 2 ) ? 1 : 0 ;        // offset at bottom
    int os_c = ( n % 2 ) ? 1 - os : os ;  // offset at top
    for ( int i = os; i < n - os_c; i++ ) {
      circuit.push_back( std::make_unique< RZ >( i , pi ) ) ;
    }
    for ( int i = os; i < n - os_c - 1; i += 2 ) {
      circuit.push_back( std::make_unique< RX >( i     , pi/2 ) ) ;
      circuit.push_back( std::make_unique< RX >( i + 1 , pi/2 ) ) ;
      circuit.push_back( std::make_unique< CX >( i , i + 1 ) ) ;
      circuit.push_back( std::make_unique< RX >( i     , pi ) ) ;
      circuit.push_back( std::make_unique< RZ >( i + 1 , pi ) ) ;
      circuit.push_back( std::make_unique< CX >( i , i + 1 ) ) ;
      circuit.push_back( std::make_unique< RX >( i     , -pi/2 ) ) ;
      circuit.push_back( std::make_unique< RX >( i + 1 , -pi/2 ) ) ;
    }
  }

}